

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O0

void __thiscall
PenguinV_Image::ImageTemplate<float>::FunctionFacade::FunctionFacade(FunctionFacade *this)

{
  value_type *in_RDI;
  size_type in_stack_ffffffffffffffc8;
  vector<float_*(*)(unsigned_long),_std::allocator<float_*(*)(unsigned_long)>_>
  *in_stack_ffffffffffffffd0;
  vector<void_(*)(float_*,_float,_unsigned_long),_std::allocator<void_(*)(float_*,_float,_unsigned_long)>_>
  *this_00;
  
  std::vector<float_*(*)(unsigned_long),_std::allocator<float_*(*)(unsigned_long)>_>::vector
            ((vector<float_*(*)(unsigned_long),_std::allocator<float_*(*)(unsigned_long)>_> *)
             0x1be2d0);
  std::vector<void_(*)(float_*),_std::allocator<void_(*)(float_*)>_>::vector
            ((vector<void_(*)(float_*),_std::allocator<void_(*)(float_*)>_> *)0x1be2e3);
  std::
  vector<void_(*)(float_*,_float_*,_unsigned_long),_std::allocator<void_(*)(float_*,_float_*,_unsigned_long)>_>
  ::vector((vector<void_(*)(float_*,_float_*,_unsigned_long),_std::allocator<void_(*)(float_*,_float_*,_unsigned_long)>_>
            *)0x1be2f6);
  std::
  vector<void_(*)(float_*,_float,_unsigned_long),_std::allocator<void_(*)(float_*,_float,_unsigned_long)>_>
  ::vector((vector<void_(*)(float_*,_float,_unsigned_long),_std::allocator<void_(*)(float_*,_float,_unsigned_long)>_>
            *)0x1be309);
  std::vector<float_*(*)(unsigned_long),_std::allocator<float_*(*)(unsigned_long)>_>::resize
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(value_type *)in_RDI);
  std::vector<void_(*)(float_*),_std::allocator<void_(*)(float_*)>_>::resize
            ((vector<void_(*)(float_*),_std::allocator<void_(*)(float_*)>_> *)
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(value_type *)in_RDI);
  this_00 = (vector<void_(*)(float_*,_float,_unsigned_long),_std::allocator<void_(*)(float_*,_float,_unsigned_long)>_>
             *)0x0;
  std::
  vector<void_(*)(float_*,_float_*,_unsigned_long),_std::allocator<void_(*)(float_*,_float_*,_unsigned_long)>_>
  ::resize((vector<void_(*)(float_*,_float_*,_unsigned_long),_std::allocator<void_(*)(float_*,_float_*,_unsigned_long)>_>
            *)0x0,in_stack_ffffffffffffffc8,in_RDI);
  std::
  vector<void_(*)(float_*,_float,_unsigned_long),_std::allocator<void_(*)(float_*,_float,_unsigned_long)>_>
  ::resize(this_00,0,(value_type *)in_RDI);
  return;
}

Assistant:

FunctionFacade()
            {
                _allocate  .resize( 256, nullptr );
                _deallocate.resize( 256, nullptr );
                _copy      .resize( 256, nullptr );
                _set       .resize( 256, nullptr );
            }